

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.h
# Opt level: O3

node<adj_ribs_in_data> *
search_prefix<adj_ribs_in_data>
          (node<adj_ribs_in_data> *root,uint32_t address,uint8_t max_prefix_len,
          bool is_prefix_strict)

{
  bool bVar1;
  undefined3 in_register_00000011;
  uint8_t n;
  node<adj_ribs_in_data> *pnVar2;
  
  if (CONCAT31(in_register_00000011,max_prefix_len) != 0) {
    n = '\0';
    pnVar2 = root;
    do {
      bVar1 = check_bit(address,n);
      pnVar2 = (&pnVar2->node_0)[bVar1];
      if (pnVar2 == (node<adj_ribs_in_data> *)0x0) {
        if (!is_prefix_strict) {
          return root;
        }
        return (node<adj_ribs_in_data> *)0x0;
      }
      if (pnVar2->is_prefix != false) {
        root = pnVar2;
      }
      n = n + '\x01';
    } while (max_prefix_len != n);
    if ((is_prefix_strict) && (root->prefix_len == '\0')) {
      root = (node<adj_ribs_in_data> *)0x0;
    }
  }
  return root;
}

Assistant:

node<DATA_TYPE>* search_prefix(node<DATA_TYPE>* root, uint32_t address, uint8_t max_prefix_len = 32, bool is_prefix_strict = false){
    node<DATA_TYPE>* current = root;
    node<DATA_TYPE>* next = nullptr;
    node<DATA_TYPE>* match_node = root;
    uint8_t i = 0;
    while(i < max_prefix_len){
        next = (check_bit(address, i) ? current->node_1 : current->node_0);
        if(next == nullptr){
            if(is_prefix_strict){
                return nullptr;
            }
            return match_node;
        }
        if(next->is_prefix){
            match_node = next;
        }
        current = next;
        i++;
    }
    if(is_prefix_strict and max_prefix_len != 0 and match_node->prefix_len == 0){
        return nullptr;
    }
    return match_node;
}